

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
               (string *s,char *fmt,Normal3<float> *v,Vector3<float> *args,Vector3<float> *args_1,
               Normal3<float> *args_2,Normal3<float> *args_3,char **args_4,char **args_5,
               Vector3<float> *args_6,Vector3<float> *args_7,float *args_8,float *args_9,
               float *args_10,float *args_11,int *args_12)

{
  long lVar1;
  ulong uVar2;
  string *in_RCX;
  char **unaff_RBP;
  string *in_RDI;
  char *in_R8;
  Vector3<float> *in_R9;
  char **unaff_R15;
  Vector3<float> *unaff_retaddr;
  Vector3<float> *in_stack_00000008;
  float *in_stack_00000010;
  float *in_stack_00000018;
  float *in_stack_00000020;
  float *in_stack_00000028;
  int *in_stack_00000030;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  Normal3<float> *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  string *in_stack_fffffffffffffd40;
  char **in_stack_fffffffffffffd48;
  char **in_stack_fffffffffffffd50;
  Normal3<float> *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  string local_288 [32];
  string local_268 [32];
  char *in_stack_fffffffffffffdb8;
  string local_240 [4];
  int in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  LogLevel in_stack_fffffffffffffdd4;
  stringstream local_220 [413];
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [8];
  Normal3<float> *in_stack_ffffffffffffff88;
  Normal3<float> *in_stack_ffffffffffffff90;
  Vector3<float> *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
             in_stack_fffffffffffffdb8);
  }
  if ((bool)local_83) {
    LogFatal(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
             in_stack_fffffffffffffdb8);
  }
  if ((local_82 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
               in_stack_fffffffffffffdb8);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::Normal3<float>const&>(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    std::__cxx11::string::operator+=(in_RDI,local_288);
    std::__cxx11::string::~string(local_288);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_220);
    pbrt::operator<<(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::operator+=(in_RDI,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream(local_220);
  }
  stringPrintfRecursive<pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>&,pbrt::Vector3<float>&,float&,float&,float&,float&,int_const&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}